

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::ByteSize(Extension *this,int number)

{
  FieldType FVar1;
  type_info *ptVar2;
  long lVar3;
  int iVar4;
  LogMessage *other;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->is_repeated != true) {
    if ((this->field_0xa & 1) != 0) {
      return 0;
    }
    uVar12 = (uint)this->type;
    uVar11 = number * 8 + 1;
    uVar6 = 0x1f;
    if (uVar11 != 0) {
      for (; uVar11 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar13 = (ulong)uVar6;
    sVar9 = (ulong)(uVar6 * 9 + 0x49 >> 6) << (uVar12 == 10);
    if (0x11 < uVar12 - 1) {
      return sVar9;
    }
    switch(uVar12) {
    default:
      return sVar9 + 8;
    case 2:
    case 7:
    case 0xf:
      return sVar9 + 4;
    case 3:
    case 4:
      uVar13 = (this->field_0).uint64_value;
      goto LAB_002c08f7;
    case 5:
    case 0xe:
      uVar13 = (ulong)(uint)(this->field_0).int32_value;
      if ((this->field_0).int32_value < 0) {
        uVar13 = 10;
        goto LAB_002c0ac0;
      }
      break;
    case 8:
      return sVar9 + 1;
    case 9:
    case 0xc:
      uVar13 = ((this->field_0).string_value)->_M_string_length;
      goto LAB_002c0aae;
    case 10:
      uVar13 = (**(code **)(*(long *)(this->field_0).repeated_string_value + 0x58))
                         ((type_info *)(this->field_0).repeated_string_value,uVar13,
                          (void *)((long)&switchD_002c050e::switchdataD_0059f868 +
                                  (long)(int)(&switchD_002c050e::switchdataD_0059f868)[uVar12 - 1]))
      ;
      goto LAB_002c0ac0;
    case 0xb:
      ptVar2 = (type_info *)(this->field_0).repeated_string_value;
      if ((this->field_0xa & 0x10) == 0) {
        uVar13 = (**(code **)(*(long *)ptVar2 + 0x58))
                           (ptVar2,uVar13,
                            (void *)((long)&switchD_002c050e::switchdataD_0059f868 +
                                    (long)(int)(&switchD_002c050e::switchdataD_0059f868)[uVar12 - 1]
                                    ));
      }
      else {
        iVar4 = (**(code **)(*(long *)ptVar2 + 0x50))(ptVar2,uVar13);
        uVar13 = (ulong)iVar4;
      }
LAB_002c0aae:
      sVar9 = sVar9 + uVar13;
      break;
    case 0xd:
      uVar13 = (ulong)(this->field_0).uint32_value;
      break;
    case 0x11:
      uVar6 = (this->field_0).int32_value >> 0x1f ^ (this->field_0).int32_value * 2 | 1;
      iVar4 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      goto LAB_002c0ab7;
    case 0x12:
      uVar13 = (this->field_0).int64_value >> 0x3f ^ (this->field_0).int64_value * 2;
LAB_002c08f7:
      lVar8 = 0x3f;
      if ((uVar13 | 1) != 0) {
        for (; (uVar13 | 1) >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      iVar4 = (int)lVar8;
      goto LAB_002c0ab7;
    }
    uVar6 = (uint)uVar13 | 1;
    iVar4 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
LAB_002c0ab7:
    uVar13 = (ulong)(iVar4 * 9 + 0x49U >> 6);
LAB_002c0ac0:
    return sVar9 + uVar13;
  }
  FVar1 = this->type;
  if (this->is_packed == true) {
    switch(FVar1) {
    case '\x01':
    case '\x06':
    case '\x10':
      uVar10 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 3;
      break;
    case '\x02':
    case '\a':
    case '\x0f':
      uVar10 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 2;
      break;
    case '\x03':
      lVar8 = (long)((this->field_0).repeated_int32_value)->current_size_;
      if (lVar8 < 1) goto switchD_002c0439_default;
      lVar7 = 0;
      uVar10 = 0;
      do {
        uVar13 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                           lVar7 * 8) | 1;
        lVar3 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar10 = uVar10 + ((int)lVar3 * 9 + 0x49U >> 6);
        lVar7 = lVar7 + 1;
      } while (lVar8 != lVar7);
      break;
    case '\x04':
      lVar8 = (long)((this->field_0).repeated_int32_value)->current_size_;
      if (lVar8 < 1) goto switchD_002c0439_default;
      lVar7 = 0;
      uVar10 = 0;
      do {
        uVar13 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                           lVar7 * 8) | 1;
        lVar3 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar10 = uVar10 + ((int)lVar3 * 9 + 0x49U >> 6);
        lVar7 = lVar7 + 1;
      } while (lVar8 != lVar7);
      break;
    case '\x05':
      lVar8 = (long)((this->field_0).repeated_int32_value)->current_size_;
      if (lVar8 < 1) goto switchD_002c0439_default;
      lVar7 = 0;
      uVar10 = 0;
      do {
        uVar6 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                         lVar7 * 4);
        if ((int)uVar6 < 0) {
          uVar13 = 10;
        }
        else {
          uVar6 = uVar6 | 1;
          iVar4 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          uVar13 = (ulong)(iVar4 * 9 + 0x49U >> 6);
        }
        uVar10 = uVar10 + uVar13;
        lVar7 = lVar7 + 1;
      } while (lVar8 != lVar7);
      break;
    case '\b':
      uVar10 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x646);
      other = LogMessage::operator<<(&local_50,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_51,other);
      LogMessage::~LogMessage(&local_50);
    default:
switchD_002c0439_default:
      this->cached_size = 0;
      return 0;
    case '\r':
      lVar8 = (long)((this->field_0).repeated_int32_value)->current_size_;
      if (lVar8 < 1) goto switchD_002c0439_default;
      lVar7 = 0;
      uVar10 = 0;
      do {
        uVar6 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                         lVar7 * 4) | 1;
        iVar4 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar10 = uVar10 + (iVar4 * 9 + 0x49U >> 6);
        lVar7 = lVar7 + 1;
      } while (lVar8 != lVar7);
      break;
    case '\x0e':
      lVar8 = (long)((this->field_0).repeated_int32_value)->current_size_;
      if (lVar8 < 1) goto switchD_002c0439_default;
      lVar7 = 0;
      uVar10 = 0;
      do {
        uVar6 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                         lVar7 * 4);
        if ((int)uVar6 < 0) {
          uVar13 = 10;
        }
        else {
          uVar6 = uVar6 | 1;
          iVar4 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          uVar13 = (ulong)(iVar4 * 9 + 0x49U >> 6);
        }
        uVar10 = uVar10 + uVar13;
        lVar7 = lVar7 + 1;
      } while (lVar8 != lVar7);
      break;
    case '\x11':
      lVar8 = (long)((this->field_0).repeated_int32_value)->current_size_;
      if (lVar8 < 1) goto switchD_002c0439_default;
      lVar7 = 0;
      uVar10 = 0;
      do {
        iVar4 = *(int *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                        lVar7 * 4);
        uVar6 = iVar4 >> 0x1f ^ iVar4 * 2 | 1;
        iVar4 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar10 = uVar10 + (iVar4 * 9 + 0x49U >> 6);
        lVar7 = lVar7 + 1;
      } while (lVar8 != lVar7);
      break;
    case '\x12':
      lVar8 = (long)((this->field_0).repeated_int32_value)->current_size_;
      if (lVar8 < 1) goto switchD_002c0439_default;
      lVar7 = 0;
      uVar10 = 0;
      do {
        lVar3 = *(long *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                         lVar7 * 8);
        uVar13 = lVar3 >> 0x3f ^ lVar3 * 2 | 1;
        lVar3 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar10 = uVar10 + ((int)lVar3 * 9 + 0x49U >> 6);
        lVar7 = lVar7 + 1;
      } while (lVar8 != lVar7);
    }
    this->cached_size = (uint)uVar10;
    if (uVar10 == 0) {
LAB_002c0ac3:
      return 0;
    }
    uVar6 = (uint)uVar10 | 1;
    iVar4 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    uVar13 = (ulong)(iVar4 * 9 + 0x49U >> 6);
    uVar6 = number * 8 + 3;
    iVar4 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar9 = uVar10 + (iVar4 * 9 + 0x49U >> 6);
    goto LAB_002c0ac0;
  }
  uVar6 = number * 8 + 1;
  iVar4 = 0x1f;
  if (uVar6 != 0) {
    for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
    }
  }
  lVar8 = (ulong)(iVar4 * 9 + 0x49U >> 6) << (FVar1 == '\n');
  switch(FVar1) {
  case '\x01':
  case '\x06':
  case '\x10':
    lVar8 = lVar8 + 8;
    goto LAB_002c072b;
  case '\x02':
  case '\a':
  case '\x0f':
    lVar8 = lVar8 + 4;
    goto LAB_002c072b;
  case '\x03':
    uVar6 = ((this->field_0).repeated_int32_value)->current_size_;
    sVar9 = lVar8 * (ulong)uVar6;
    if (0 < (int)uVar6) {
      uVar13 = 0;
      do {
        uVar10 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                           uVar13 * 8) | 1;
        lVar8 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        sVar9 = sVar9 + ((int)lVar8 * 9 + 0x49U >> 6);
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
    }
    break;
  case '\x04':
    uVar6 = ((this->field_0).repeated_int32_value)->current_size_;
    sVar9 = lVar8 * (ulong)uVar6;
    if (0 < (int)uVar6) {
      uVar13 = 0;
      do {
        uVar10 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                           uVar13 * 8) | 1;
        lVar8 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        sVar9 = sVar9 + ((int)lVar8 * 9 + 0x49U >> 6);
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
    }
    break;
  case '\x05':
    uVar6 = ((this->field_0).repeated_int32_value)->current_size_;
    sVar9 = lVar8 * (ulong)uVar6;
    if (0 < (int)uVar6) {
      uVar13 = 0;
      do {
        uVar12 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                          uVar13 * 4);
        if ((int)uVar12 < 0) {
          uVar10 = 10;
        }
        else {
          uVar12 = uVar12 | 1;
          iVar4 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          uVar10 = (ulong)(iVar4 * 9 + 0x49U >> 6);
        }
        sVar9 = sVar9 + uVar10;
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
    }
    break;
  case '\b':
    lVar8 = lVar8 + 1;
LAB_002c072b:
    sVar9 = lVar8 * (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
    break;
  case '\t':
    uVar6 = (((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).current_size_;
    sVar9 = lVar8 * (ulong)uVar6;
    if (0 < (int)uVar6) {
      uVar13 = 0;
      do {
        lVar8 = *(long *)((long)((((this->field_0).repeated_string_value)->
                                 super_RepeatedPtrFieldBase).rep_)->elements[uVar13] + 8);
        uVar12 = (uint)lVar8 | 1;
        iVar4 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar9 = sVar9 + lVar8 + (ulong)(iVar4 * 9 + 0x49U >> 6);
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
    }
    break;
  case '\n':
    pRVar5 = (this->field_0).repeated_string_value;
    uVar6 = (pRVar5->super_RepeatedPtrFieldBase).current_size_;
    sVar9 = lVar8 * (ulong)uVar6;
    if (0 < (int)uVar6) {
      lVar8 = 0;
      do {
        lVar7 = (**(code **)(*((pRVar5->super_RepeatedPtrFieldBase).rep_)->elements[lVar8] + 0x58))
                          ();
        sVar9 = sVar9 + lVar7;
        lVar8 = lVar8 + 1;
        pRVar5 = (this->field_0).repeated_string_value;
      } while (lVar8 < (pRVar5->super_RepeatedPtrFieldBase).current_size_);
    }
    break;
  case '\v':
    pRVar5 = (this->field_0).repeated_string_value;
    uVar6 = (pRVar5->super_RepeatedPtrFieldBase).current_size_;
    sVar9 = lVar8 * (ulong)uVar6;
    if (0 < (int)uVar6) {
      lVar8 = 0;
      do {
        lVar7 = (**(code **)(*((pRVar5->super_RepeatedPtrFieldBase).rep_)->elements[lVar8] + 0x58))
                          ();
        uVar6 = (uint)lVar7 | 1;
        iVar4 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar9 = sVar9 + lVar7 + (ulong)(iVar4 * 9 + 0x49U >> 6);
        lVar8 = lVar8 + 1;
        pRVar5 = (this->field_0).repeated_string_value;
      } while (lVar8 < (pRVar5->super_RepeatedPtrFieldBase).current_size_);
    }
    break;
  case '\f':
    uVar6 = (((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).current_size_;
    sVar9 = lVar8 * (ulong)uVar6;
    if (0 < (int)uVar6) {
      uVar13 = 0;
      do {
        lVar8 = *(long *)((long)((((this->field_0).repeated_string_value)->
                                 super_RepeatedPtrFieldBase).rep_)->elements[uVar13] + 8);
        uVar12 = (uint)lVar8 | 1;
        iVar4 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar9 = sVar9 + lVar8 + (ulong)(iVar4 * 9 + 0x49U >> 6);
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
    }
    break;
  case '\r':
    uVar6 = ((this->field_0).repeated_int32_value)->current_size_;
    sVar9 = lVar8 * (ulong)uVar6;
    if (0 < (int)uVar6) {
      uVar13 = 0;
      do {
        uVar12 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                          uVar13 * 4) | 1;
        iVar4 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar9 = sVar9 + (iVar4 * 9 + 0x49U >> 6);
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
    }
    break;
  case '\x0e':
    uVar6 = ((this->field_0).repeated_int32_value)->current_size_;
    sVar9 = lVar8 * (ulong)uVar6;
    if (0 < (int)uVar6) {
      uVar13 = 0;
      do {
        uVar12 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                          uVar13 * 4);
        if ((int)uVar12 < 0) {
          uVar10 = 10;
        }
        else {
          uVar12 = uVar12 | 1;
          iVar4 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          uVar10 = (ulong)(iVar4 * 9 + 0x49U >> 6);
        }
        sVar9 = sVar9 + uVar10;
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
    }
    break;
  case '\x11':
    uVar6 = ((this->field_0).repeated_int32_value)->current_size_;
    sVar9 = lVar8 * (ulong)uVar6;
    if (0 < (int)uVar6) {
      uVar13 = 0;
      do {
        iVar4 = *(int *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                        uVar13 * 4);
        uVar12 = iVar4 >> 0x1f ^ iVar4 * 2 | 1;
        iVar4 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar9 = sVar9 + (iVar4 * 9 + 0x49U >> 6);
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
    }
    break;
  case '\x12':
    uVar6 = ((this->field_0).repeated_int32_value)->current_size_;
    sVar9 = lVar8 * (ulong)uVar6;
    if (0 < (int)uVar6) {
      uVar13 = 0;
      do {
        lVar8 = *(long *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                         uVar13 * 8);
        uVar10 = lVar8 >> 0x3f ^ lVar8 * 2 | 1;
        lVar8 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        sVar9 = sVar9 + ((int)lVar8 * 9 + 0x49U >> 6);
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
    }
    break;
  default:
    goto LAB_002c0ac3;
  }
  return sVar9;
}

Assistant:

size_t ExtensionSet::Extension::ByteSize(int number) const {
  size_t result = 0;

  if (is_repeated) {
    if (is_packed) {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                 \
  case WireFormatLite::TYPE_##UPPERCASE:                             \
    for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) { \
      result += WireFormatLite::CAMELCASE##Size(                     \
          repeated_##LOWERCASE##_value->Get(i));                     \
    }                                                                \
    break

        HANDLE_TYPE(INT32, Int32, int32);
        HANDLE_TYPE(INT64, Int64, int64);
        HANDLE_TYPE(UINT32, UInt32, uint32);
        HANDLE_TYPE(UINT64, UInt64, uint64);
        HANDLE_TYPE(SINT32, SInt32, int32);
        HANDLE_TYPE(SINT64, SInt64, int64);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)             \
  case WireFormatLite::TYPE_##UPPERCASE:                         \
    result += WireFormatLite::k##CAMELCASE##Size *               \
              FromIntSize(repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32);
        HANDLE_TYPE(FIXED64, Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32, int32);
        HANDLE_TYPE(SFIXED64, SFixed64, int64);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }

      cached_size = ToCachedSize(result);
      if (result > 0) {
        result += io::CodedOutputStream::VarintSize32(result);
        result += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
      }
    } else {
      size_t tag_size = WireFormatLite::TagSize(number, real_type(type));

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE:                                    \
    result += tag_size * FromIntSize(repeated_##LOWERCASE##_value->size()); \
    for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {        \
      result += WireFormatLite::CAMELCASE##Size(                            \
          repeated_##LOWERCASE##_value->Get(i));                            \
    }                                                                       \
    break

        HANDLE_TYPE(INT32, Int32, int32);
        HANDLE_TYPE(INT64, Int64, int64);
        HANDLE_TYPE(UINT32, UInt32, uint32);
        HANDLE_TYPE(UINT64, UInt64, uint64);
        HANDLE_TYPE(SINT32, SInt32, int32);
        HANDLE_TYPE(SINT64, SInt64, int64);
        HANDLE_TYPE(STRING, String, string);
        HANDLE_TYPE(BYTES, Bytes, string);
        HANDLE_TYPE(ENUM, Enum, enum);
        HANDLE_TYPE(GROUP, Group, message);
        HANDLE_TYPE(MESSAGE, Message, message);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)             \
  case WireFormatLite::TYPE_##UPPERCASE:                         \
    result += (tag_size + WireFormatLite::k##CAMELCASE##Size) *  \
              FromIntSize(repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32);
        HANDLE_TYPE(FIXED64, Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32, int32);
        HANDLE_TYPE(SFIXED64, SFixed64, int64);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    result += WireFormatLite::TagSize(number, real_type(type));
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)      \
  case WireFormatLite::TYPE_##UPPERCASE:                  \
    result += WireFormatLite::CAMELCASE##Size(LOWERCASE); \
    break

      HANDLE_TYPE(INT32, Int32, int32_value);
      HANDLE_TYPE(INT64, Int64, int64_value);
      HANDLE_TYPE(UINT32, UInt32, uint32_value);
      HANDLE_TYPE(UINT64, UInt64, uint64_value);
      HANDLE_TYPE(SINT32, SInt32, int32_value);
      HANDLE_TYPE(SINT64, SInt64, int64_value);
      HANDLE_TYPE(STRING, String, *string_value);
      HANDLE_TYPE(BYTES, Bytes, *string_value);
      HANDLE_TYPE(ENUM, Enum, enum_value);
      HANDLE_TYPE(GROUP, Group, *message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE: {
        if (is_lazy) {
          size_t size = lazymessage_value->ByteSize();
          result += io::CodedOutputStream::VarintSize32(size) + size;
        } else {
          result += WireFormatLite::MessageSize(*message_value);
        }
        break;
      }

      // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE)         \
  case WireFormatLite::TYPE_##UPPERCASE:          \
    result += WireFormatLite::k##CAMELCASE##Size; \
    break
        HANDLE_TYPE(FIXED32, Fixed32);
        HANDLE_TYPE(FIXED64, Fixed64);
        HANDLE_TYPE(SFIXED32, SFixed32);
        HANDLE_TYPE(SFIXED64, SFixed64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE
    }
  }

  return result;
}